

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

void hexnan(U *rvp,char **sp)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  byte bVar8;
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  
  pbVar6 = (byte *)(*sp + 1);
  do {
    pbVar5 = pbVar6;
    pbVar6 = pbVar5 + 1;
  } while ((byte)(*pbVar5 - 1) < 0x20);
  if ((*pbVar5 != 0x30) || ((*pbVar6 | 0x20) != 0x78)) {
    pbVar6 = pbVar5 + -1;
  }
  bVar8 = pbVar6[1];
  if (bVar8 == 0) {
    uVar10 = 0;
    uVar7 = 0;
  }
  else {
    pbVar6 = pbVar6 + 1;
    bVar1 = true;
    bVar9 = false;
    uVar7 = 0;
    uVar10 = 0;
    do {
      bVar3 = false;
      while( true ) {
        pbVar6 = pbVar6 + 1;
        uVar11 = (ulong)bVar8;
        if (""[uVar11] != 0) break;
        if (0x20 < bVar8) goto LAB_00110a6d;
        bVar2 = bVar1;
        bVar4 = bVar3;
        if (bVar9) {
          bVar2 = false;
          bVar4 = true;
        }
        if (bVar1) {
          bVar3 = bVar4;
        }
        bVar8 = *pbVar6;
        bVar1 = bVar2;
        if (bVar8 == 0) goto LAB_00110a80;
      }
      if (bVar3) {
        uVar7 = uVar10;
        uVar10 = 0;
      }
      if (bVar1) {
        uVar7 = uVar7 << 4 | uVar10 >> 0x1c;
      }
      uVar10 = uVar10 << 4 | ""[uVar11] & 0xf;
      bVar8 = *pbVar6;
      bVar9 = true;
    } while (bVar8 != 0);
  }
  goto LAB_00110a80;
  while( true ) {
    bVar8 = *pbVar6;
    uVar11 = (ulong)(uint)(int)(char)bVar8;
    pbVar6 = pbVar6 + 1;
    if ((int)(char)bVar8 == 0) break;
LAB_00110a6d:
    if ((int)uVar11 == 0x29) {
      *sp = (char *)pbVar6;
      break;
    }
  }
LAB_00110a80:
  if ((uVar7 & 0xfffff) != 0 || uVar10 != 0) {
    rvp->L[1] = uVar7 & 0xfffff | 0x7ff00000;
    rvp->L[0] = uVar10;
  }
  return;
}

Assistant:

static void
hexnan(U *rvp, const char **sp)
{
	ULong c, x[2];
	const char *s;
	int c1, havedig, udx0, xshift;

	/**** if (!hexdig['0']) hexdig_init(); ****/
	x[0] = x[1] = 0;
	havedig = xshift = 0;
	udx0 = 1;
	s = *sp;
	/* allow optional initial 0x or 0X */
	while((c = *(const unsigned char*)(s+1)) && c <= ' ')
		++s;
	if (s[1] == '0' && (s[2] == 'x' || s[2] == 'X'))
		s += 2;
	while((c = *(const unsigned char*)++s)) {
		if ((c1 = hexdig[c]))
			c  = c1 & 0xf;
		else if (c <= ' ') {
			if (udx0 && havedig) {
				udx0 = 0;
				xshift = 1;
				}
			continue;
			}
#ifdef GDTOA_NON_PEDANTIC_NANCHECK
		else if (/*(*/ c == ')' && havedig) {
			*sp = s + 1;
			break;
			}
		else
			return;	/* invalid form: don't change *sp */
#else
		else {
			do {
				if (/*(*/ c == ')') {
					*sp = s + 1;
					break;
					}
				} while((c = *++s));
			break;
			}
#endif
		havedig = 1;
		if (xshift) {
			xshift = 0;
			x[0] = x[1];
			x[1] = 0;
			}
		if (udx0)
			x[0] = (x[0] << 4) | (x[1] >> 28);
		x[1] = (x[1] << 4) | c;
		}
	if ((x[0] &= 0xfffff) || x[1]) {
		word0(rvp) = Exp_mask | x[0];
		word1(rvp) = x[1];
		}
	}